

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O1

Status __thiscall leveldb::DB::Open(DB *this,Options *options,string *dbname,DB **dbptr)

{
  uint64_t number;
  Env *pEVar1;
  _func_int **pp_Var2;
  int iVar3;
  DBImpl *this_00;
  Writer *this_01;
  MemTable *this_02;
  bool save_manifest;
  WritableFile *lfile;
  VersionEdit edit;
  DB local_110;
  DB **local_108;
  WritableFile *local_100;
  string local_f8;
  VersionEdit local_d8;
  
  *dbptr = (DB *)0x0;
  local_108 = dbptr;
  this_00 = (DBImpl *)operator_new(0x2e0);
  DBImpl::DBImpl(this_00,options,dbname);
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this_00->mutex_);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  VersionEdit::VersionEdit(&local_d8);
  DBImpl::Recover((DBImpl *)this,(VersionEdit *)this_00,(bool *)&local_d8);
  if ((this->_vptr_DB == (_func_int **)0x0) && (this_00->mem_ == (MemTable *)0x0)) {
    number = this_00->versions_->next_file_number_;
    this_00->versions_->next_file_number_ = number + 1;
    pEVar1 = options->env;
    LogFileName(&local_f8,dbname,number);
    (*pEVar1->_vptr_Env[4])(&local_110,pEVar1,&local_f8,&local_100);
    pp_Var2 = this->_vptr_DB;
    this->_vptr_DB = (_func_int **)local_110;
    local_110._vptr_DB = pp_Var2;
    if (pp_Var2 != (_func_int **)0x0) {
      operator_delete__(pp_Var2);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    if (this->_vptr_DB == (_func_int **)0x0) {
      local_d8.has_log_number_ = true;
      this_00->logfile_ = local_100;
      this_00->logfile_number_ = number;
      local_d8.log_number_ = number;
      this_01 = (Writer *)operator_new(0x20);
      log::Writer::Writer(this_01,local_100);
      this_00->log_ = this_01;
      this_02 = (MemTable *)operator_new(0x70);
      MemTable::MemTable(this_02,&this_00->internal_comparator_);
      this_00->mem_ = this_02;
      this_02->refs_ = this_02->refs_ + 1;
    }
  }
  if (this->_vptr_DB == (_func_int **)0x0) {
    DBImpl::DeleteObsoleteFiles(this_00);
    DBImpl::MaybeScheduleCompaction(this_00);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this_00->mutex_);
  if (this->_vptr_DB == (_func_int **)0x0) {
    if (this_00->mem_ == (MemTable *)0x0) {
      __assert_fail("impl->mem_ != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_impl.cc"
                    ,0x6b3,
                    "static Status leveldb::DB::Open(const Options &, const std::string &, DB **)");
    }
    *local_108 = (DB *)this_00;
  }
  else {
    (*(this_00->super_DB)._vptr_DB[1])(this_00);
  }
  VersionEdit::~VersionEdit(&local_d8);
  return (Status)(char *)this;
}

Assistant:

Status DB::Open(const Options& options, const std::string& dbname, DB** dbptr) {
  *dbptr = nullptr;

  DBImpl* impl = new DBImpl(options, dbname);
  impl->mutex_.Lock();
  VersionEdit edit;
  // Recover handles create_if_missing, error_if_exists
  bool save_manifest = false;
  Status s = impl->Recover(&edit, &save_manifest);
  if (s.ok() && impl->mem_ == nullptr) {
    // Create new log and a corresponding memtable.
    uint64_t new_log_number = impl->versions_->NewFileNumber();
    WritableFile* lfile;
    s = options.env->NewWritableFile(LogFileName(dbname, new_log_number),
                                     &lfile);
    if (s.ok()) {
      edit.SetLogNumber(new_log_number);
      impl->logfile_ = lfile;
      impl->logfile_number_ = new_log_number;
      impl->log_ = new log::Writer(lfile);
      impl->mem_ = new MemTable(impl->internal_comparator_);
      impl->mem_->Ref();
    }
  }
  if (s.ok() && save_manifest) {
    edit.SetPrevLogNumber(0);  // No older logs needed after recovery.
    edit.SetLogNumber(impl->logfile_number_);
    s = impl->versions_->LogAndApply(&edit, &impl->mutex_);
  }
  if (s.ok()) {
    impl->DeleteObsoleteFiles();
    impl->MaybeScheduleCompaction();
  }
  impl->mutex_.Unlock();
  if (s.ok()) {
    assert(impl->mem_ != nullptr);
    *dbptr = impl;
  } else {
    delete impl;
  }
  return s;
}